

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O1

void __thiscall
github111116::ConsoleLogger::ConsoleLogger(ConsoleLogger *this,ostream *out,bool colored)

{
  this->out = out;
  (this->infoColor)._M_dataplus._M_p = (pointer)&(this->infoColor).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->infoColor,"\x1b[0;32m","");
  (this->warnColor)._M_dataplus._M_p = (pointer)&(this->warnColor).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->warnColor,"\x1b[1;33m","");
  (this->errorColor)._M_dataplus._M_p = (pointer)&(this->errorColor).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->errorColor,"\x1b[1;31m","");
  (this->debugColor)._M_dataplus._M_p = (pointer)&(this->debugColor).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->debugColor,"\x1b[1;30m","");
  this->colored = colored;
  this->loglevel = 0;
  (this->starttimes)._M_h._M_buckets = &(this->starttimes)._M_h._M_single_bucket;
  (this->starttimes)._M_h._M_bucket_count = 1;
  (this->starttimes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->starttimes)._M_h._M_element_count = 0;
  (this->starttimes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->starttimes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->starttimes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->counts)._M_h._M_buckets = &(this->counts)._M_h._M_single_bucket;
  (this->counts)._M_h._M_bucket_count = 1;
  (this->counts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->counts)._M_h._M_element_count = 0;
  (this->counts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->counts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->counts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

inline ConsoleLogger::ConsoleLogger(std::ostream& out, bool colored):
	out(out), colored(colored)
{
}